

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_string_field.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::StringOneofFieldGenerator::GenerateMergeFromCodedStream
          (StringOneofFieldGenerator *this,Printer *printer)

{
  Type TVar1;
  Printer *printer_local;
  StringOneofFieldGenerator *this_local;
  
  io::Printer::Print(printer,&(this->super_StringFieldGenerator).variables_,
                     "DO_(::google::protobuf::internal::WireFormatLite::Read$declared_type$(\n      input, this->mutable_$name$()));\n"
                    );
  TVar1 = FieldDescriptor::type((this->super_StringFieldGenerator).descriptor_);
  if (TVar1 == TYPE_STRING) {
    GenerateUtf8CheckCodeForString
              ((this->super_StringFieldGenerator).descriptor_,
               (this->super_StringFieldGenerator).super_FieldGenerator.options_,true,
               &(this->super_StringFieldGenerator).variables_,
               "this->$name$().data(), this->$name$().length(),\n",printer);
  }
  return;
}

Assistant:

void StringOneofFieldGenerator::
GenerateMergeFromCodedStream(io::Printer* printer) const {
    printer->Print(variables_,
      "DO_(::google::protobuf::internal::WireFormatLite::Read$declared_type$(\n"
      "      input, this->mutable_$name$()));\n");

  if (descriptor_->type() == FieldDescriptor::TYPE_STRING) {
    GenerateUtf8CheckCodeForString(
        descriptor_, options_, true, variables_,
        "this->$name$().data(), this->$name$().length(),\n", printer);
  }
}